

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O3

ssize_t __thiscall
xercesc_4_0::XSerializeEngine::read(XSerializeEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  XMLByte *__src;
  void *extraout_RAX;
  void *pvVar1;
  XSerializationException *this_00;
  MemoryManager **ppMVar2;
  undefined4 in_register_00000034;
  void *__dest;
  XMLByte *pXVar3;
  void *pvVar4;
  XMLCh value1 [64];
  XMLCh local_a8 [64];
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  if (this->fStoreLoad == 1) {
    if (__dest != (void *)0x0) {
      ensureLoadBuffer(this);
      pvVar4 = extraout_RAX;
      if (__buf != (void *)0x0) {
        __src = this->fBufCur;
        pXVar3 = this->fBufLoadMax + -(long)__src;
        pvVar4 = (void *)((long)__buf - (long)pXVar3);
        if (__buf < pXVar3 || pvVar4 == (void *)0x0) {
          pvVar4 = memcpy(__dest,__src,(size_t)__buf);
        }
        else {
          pvVar1 = memcpy(__dest,__src,(size_t)pXVar3);
          pXVar3 = (XMLByte *)((long)__dest + (long)pXVar3);
          __buf = pvVar4;
          if ((void *)this->fBufSize <= pvVar4) {
            do {
              fillBuffer(this);
              memcpy(pXVar3,this->fBufCur,this->fBufSize);
              pvVar1 = (void *)this->fBufSize;
              pXVar3 = pXVar3 + (long)pvVar1;
              pvVar4 = (void *)((long)pvVar4 - (long)pvVar1);
              __buf = pvVar4;
            } while (pvVar1 <= pvVar4);
          }
          if (__buf == (void *)0x0) {
            return (ssize_t)pvVar1;
          }
          fillBuffer(this);
          pvVar4 = memcpy(pXVar3,this->fBufCur,(size_t)__buf);
        }
        this->fBufCur = this->fBufCur + (long)__buf;
      }
      return (ssize_t)pvVar4;
    }
    ppMVar2 = &this->fGrammarPool->fMemMgr;
    if (this->fGrammarPool == (XMLGrammarPool *)0x0) {
      ppMVar2 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    XMLString::sizeToText(0,local_a8,0x41,10,*ppMVar2);
    this_00 = (XSerializationException *)__cxa_allocate_exception(0x30);
    ppMVar2 = &this->fGrammarPool->fMemMgr;
    if (this->fGrammarPool == (XMLGrammarPool *)0x0) {
      ppMVar2 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    XSerializationException::XSerializationException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XSerializeEngine.cpp"
               ,0x400,XSer_Inv_Null_Pointer,local_a8,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,*ppMVar2
              );
  }
  else {
    this_00 = (XSerializationException *)__cxa_allocate_exception(0x30);
    if (this->fGrammarPool == (XMLGrammarPool *)0x0) {
      ppMVar2 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      ppMVar2 = &this->fGrammarPool->fMemMgr;
    }
    XSerializationException::XSerializationException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XSerializeEngine.hpp"
               ,0x2e9,XSer_Loading_Violation,*ppMVar2);
  }
  __cxa_throw(this_00,&XSerializationException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XSerializeEngine::read(XMLByte* const toRead
                          , XMLSize_t      readLen)
{
    ensureLoading();
    ensurePointer(toRead);
    ensureLoadBuffer();

    if (readLen == 0)
        return;

    /***
     *  If unread is sufficient, read it up
     ***/
    XMLSize_t dataAvail = fBufLoadMax - fBufCur;

    if (readLen <= dataAvail)
    {
        memcpy(toRead, fBufCur, readLen);
        fBufCur += readLen;
        return;
    }

    /***
     *
     * fillBuffer will discard anything left in the buffer
     * before it asks the inputStream to fill in the buffer,
     * so we need to readup everything in the buffer before
     * calling fillBuffer
     *
     ***/
    XMLByte*     tempRead   = (XMLByte*) toRead;
    XMLSize_t    readRemain = readLen;

    // read the unread
    memcpy(tempRead, fBufCur, dataAvail);
    tempRead   += dataAvail;
    readRemain -= dataAvail;

    // read chunks of fBufSize
    while (readRemain >= fBufSize)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, fBufSize);
        tempRead   += fBufSize;
        readRemain -= fBufSize;
    }

    // read the remaining if any
    if (readRemain)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, readRemain);
        fBufCur += readRemain;
    }

}